

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::ReadTag(char *p,uint32_t *out,uint32_t param_3)

{
  uint uVar1;
  uint32_t res_00;
  pair<const_char_*,_unsigned_int> pVar2;
  pair<const_char_*,_unsigned_int> tmp;
  uint32_t second;
  uint32_t res;
  uint32_t param_2_local;
  uint32_t *out_local;
  char *p_local;
  
  uVar1 = (uint)(byte)*p;
  if (uVar1 < 0x80) {
    *out = uVar1;
    p_local = p + 1;
  }
  else {
    res_00 = ((byte)p[1] - 1) * 0x80 + uVar1;
    if ((byte)p[1] < 0x80) {
      *out = res_00;
      p_local = p + 2;
    }
    else {
      pVar2 = ReadTagFallback(p,res_00);
      p_local = pVar2.first;
      *out = pVar2.second;
    }
  }
  return p_local;
}

Assistant:

inline const char* ReadTag(const char* p, uint32_t* out,
                           uint32_t /*max_tag*/ = 0) {
  uint32_t res = static_cast<uint8_t>(p[0]);
  if (res < 128) {
    *out = res;
    return p + 1;
  }
  uint32_t second = static_cast<uint8_t>(p[1]);
  res += (second - 1) << 7;
  if (second < 128) {
    *out = res;
    return p + 2;
  }
  auto tmp = ReadTagFallback(p, res);
  *out = tmp.second;
  return tmp.first;
}